

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Severity.hpp
# Opt level: O2

cx_string<4UL> binlog::severityToString(Severity severity)

{
  char *str;
  int iVar1;
  undefined6 in_register_0000003a;
  undefined8 local_10;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,severity);
  if (iVar1 == 0x20) {
    str = "TRAC";
  }
  else if (iVar1 == 0x8000) {
    str = "NOLG";
  }
  else if (iVar1 == 0x80) {
    str = "INFO";
  }
  else if (iVar1 == 0x100) {
    str = "WARN";
  }
  else if (iVar1 == 0x200) {
    str = "ERRO";
  }
  else if (iVar1 == 0x400) {
    str = "CRIT";
  }
  else if (iVar1 == 0x40) {
    str = "DEBG";
  }
  else {
    str = "UNKW";
  }
  mserialize::cx_string<4UL>::cx_string((cx_string<4UL> *)&local_10,str);
  return (char  [5])((uint5)local_10._4_4_ << 0x20 | (uint5)(uint)local_10);
}

Assistant:

inline mserialize::cx_string<4> severityToString(Severity severity)
{
  switch (severity)
  {
    case Severity::trace:    return mserialize::cx_string<4>{"TRAC"};
    case Severity::debug:    return mserialize::cx_string<4>{"DEBG"};
    case Severity::info:     return mserialize::cx_string<4>{"INFO"};
    case Severity::warning:  return mserialize::cx_string<4>{"WARN"};
    case Severity::error:    return mserialize::cx_string<4>{"ERRO"};
    case Severity::critical: return mserialize::cx_string<4>{"CRIT"};
    case Severity::no_logs:  return mserialize::cx_string<4>{"NOLG"};
    default:                 return mserialize::cx_string<4>{"UNKW"};
  }
}